

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiLabelFileParser.cpp
# Opt level: O0

void __thiscall
MultiLabelFileParser::writeLabelList(MultiLabelFileParser *this,string *labelListFilename)

{
  const_reference pvVar1;
  const_reference this_00;
  const_reference pvVar2;
  uint local_22c;
  uint local_228;
  int c;
  int l;
  string local_218 [8];
  ofstream labelListFp;
  string *labelListFilename_local;
  MultiLabelFileParser *this_local;
  
  std::ofstream::ofstream(local_218);
  std::ofstream::open(local_218,(_Ios_Openmode)labelListFilename);
  for (local_228 = 0; local_228 < this->_L; local_228 = local_228 + 1) {
    local_22c = 0;
    while( true ) {
      pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->_C,(long)(int)local_228);
      if (*pvVar1 <= local_22c) break;
      this_00 = std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[](&this->_labelList,(long)(int)local_228);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](this_00,(long)(int)local_22c);
      std::operator<<((ostream *)local_218,(string *)pvVar2);
      pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->_C,(long)(int)local_228);
      if (local_22c != *pvVar1 - 1) {
        std::operator<<((ostream *)local_218,',');
      }
      local_22c = local_22c + 1;
    }
    if (local_228 != this->_L - 1) {
      std::ostream::operator<<((ostream *)local_218,std::endl<char,std::char_traits<char>>);
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void MultiLabelFileParser::writeLabelList(string labelListFilename)const{//{{{
    ofstream labelListFp;
    labelListFp.open(labelListFilename,ios::out);
    for(int l=0; l<_L; l++){
        for(int c=0; c<_C[l]; c++){
            labelListFp<<_labelList[l][c];
            if(c != (_C[l]-1))labelListFp<<',';
        }
        if(l != (_L-1))labelListFp<<endl;
    }
    labelListFp.close();
}